

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TSymbolTable::amendSymbolIdLevel(TSymbolTable *this,TSymbol *symbol)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint local_34;
  uint64_t symbolId;
  uint64_t level;
  TSymbol *symbol_local;
  TSymbolTable *this_local;
  
  uVar1 = currentLevel(this);
  if (uVar1 < 0x80) {
    local_34 = currentLevel(this);
  }
  else {
    local_34 = 0x7f;
  }
  iVar2 = (*symbol->_vptr_TSymbol[0xf])();
  (*symbol->_vptr_TSymbol[0xe])
            (symbol,(ulong)local_34 << 0x38 | CONCAT44(extraout_var,iVar2) & 0xffffffffffffff);
  return;
}

Assistant:

void amendSymbolIdLevel(TSymbol& symbol)
    {
        // clamp level to avoid overflow
        uint64_t level = (uint32_t)currentLevel() > MaxLevelInUniqueID ? MaxLevelInUniqueID : currentLevel();
        uint64_t symbolId = symbol.getUniqueId();
        symbolId &= uniqueIdMask;
        symbolId |= (level << LevelFlagBitOffset);
        symbol.setUniqueId(symbolId);
    }